

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_rc_Ptr.h
# Opt level: O3

void __thiscall axl::rc::Ptr<axl::mem::Block>::clear(Ptr<axl::mem::Block> *this)

{
  int32_t *piVar1;
  RefCount *pRVar2;
  
  pRVar2 = this->m_refCount;
  if (pRVar2 != (RefCount *)0x0) {
    LOCK();
    piVar1 = &pRVar2->m_refCount;
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      (**pRVar2->_vptr_RefCount)(pRVar2);
      LOCK();
      piVar1 = &pRVar2->m_weakRefCount;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if ((*piVar1 == 0) && (pRVar2->m_freeFunc != (FreeFunc *)0x0)) {
        (*pRVar2->m_freeFunc)(pRVar2);
      }
    }
  }
  this->m_p = (Block *)0x0;
  this->m_refCount = (RefCount *)0x0;
  return;
}

Assistant:

void
	clear() {
		if (m_refCount)
			m_refCount->release();

		initialize();
	}